

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void diy::
     reduce<void(*)(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&),diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,RegularSwapPartners *partners,
               _func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **reduce,
               ReduceNeverSkip *skip)

{
  RegularPartners *pRVar1;
  IncomingQueues *this;
  uint uVar2;
  int round_;
  ulong uVar3;
  int iVar4;
  shared_ptr<diy::spd::logger> log;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  int local_17c;
  _func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **local_178;
  Assigner *local_170;
  RegularPartners *local_168;
  Skip local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip> local_130;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  ReductionFunctor<void,_diy::RegularSwapPartners> local_b8;
  
  local_178 = reduce;
  local_170 = assigner;
  Catch::clara::std::make_shared<diy::spd::logger>();
  local_17c = master->expected_;
  uVar3 = 0;
  local_168 = &partners->super_RegularPartners;
  while( true ) {
    pRVar1 = local_168;
    round_ = (int)uVar3;
    if ((ulong)((long)(local_168->kvs_).
                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_168->kvs_).
                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
    local_198 = (code *)0x0;
    pcStack_190 = (code *)0x0;
    local_1a8._M_unused._M_object =
         (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0;
    local_1a8._8_8_ = 0;
    if (*local_178 != (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0) {
      pcStack_190 = Catch::clara::std::
                    _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                    ::_M_invoke;
      local_198 = Catch::clara::std::
                  _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                  ::_M_manager;
      local_1a8._M_unused._0_8_ = (undefined8)*local_178;
    }
    detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
              (&local_b8,round_,(Callback *)&local_1a8,(RegularSwapPartners *)local_168,local_170);
    local_130.round = round_;
    local_130.partners = (RegularSwapPartners *)pRVar1;
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool(int,diy::Master_const&)> *)&local_160,&local_130);
    Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
              (master,&local_b8,&local_160);
    Catch::clara::std::_Function_base::~_Function_base(&local_160.super__Function_base);
    detail::ReductionFunctor<void,_diy::RegularSwapPartners>::~ReductionFunctor(&local_b8);
    Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
    Master::execute(master);
    iVar4 = 0;
    for (uVar2 = 0;
        uVar2 < (uint)((ulong)((long)(master->blocks_).elements_.
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(master->blocks_).elements_.
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3); uVar2 = uVar2 + 1) {
      local_b8._0_8_ = 0;
      local_b8.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_b8.reduce.super__Function_base._M_functor._8_8_ = 0;
      RegularPartners::fill
                (local_168,round_,
                 (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar2],
                 (vector<int,_std::allocator<int>_> *)&local_b8);
      uVar3 = (long)local_b8.reduce.super__Function_base._M_functor._M_unused._0_8_ - local_b8._0_8_
      ;
      this = Master::incoming(master,(master->gids_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[(int)uVar2]);
      concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
      ::clear(this);
      iVar4 = iVar4 + (int)(uVar3 >> 2);
      Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_b8);
    }
    master->expected_ = iVar4;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_100 = Catch::clara::std::
                _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                ::_M_invoke;
    local_108 = Catch::clara::std::
                _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                ::_M_manager;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e0 = Catch::clara::std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_invoke;
    local_e8 = Catch::clara::std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_manager;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c0 = Catch::clara::std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_invoke;
    local_c8 = Catch::clara::std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_manager;
    Master::flush(master,false,(MemoryManagement *)&local_118);
    MemoryManagement::~MemoryManagement((MemoryManagement *)&local_118);
    uVar3 = (ulong)(round_ + 1);
  }
  local_198 = (code *)0x0;
  pcStack_190 = (code *)0x0;
  local_1a8._M_unused._M_object = (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0
  ;
  local_1a8._8_8_ = 0;
  if (*local_178 != (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0) {
    pcStack_190 = Catch::clara::std::
                  _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                  ::_M_invoke;
    local_198 = Catch::clara::std::
                _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                ::_M_manager;
    local_1a8._M_unused._0_8_ = (undefined8)*local_178;
  }
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
            (&local_b8,round_,(Callback *)&local_1a8,(RegularSwapPartners *)local_168,local_170);
  local_130.round = round_;
  local_130.partners = (RegularSwapPartners *)pRVar1;
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>,void>
            ((function<bool(int,diy::Master_const&)> *)&local_160,&local_130);
  Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
            (master,&local_b8,&local_160);
  Catch::clara::std::_Function_base::~_Function_base(&local_160.super__Function_base);
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::~ReductionFunctor(&local_b8);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  master->expected_ = local_17c;
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}